

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

bool __thiscall
TPZFMatrix<long_double>::Compare(TPZFMatrix<long_double> *this,TPZSavable *copy,bool override)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  TPZFMatrix<long_double> *A;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  stringstream sout;
  longdouble local_1dc;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if (copy == (TPZSavable *)0x0) {
    A = (TPZFMatrix<long_double> *)0x0;
  }
  else {
    A = (TPZFMatrix<long_double> *)__dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
  }
  if (A != (TPZFMatrix<long_double> *)0x0) {
    bVar3 = TPZMatrix<long_double>::Compare(&this->super_TPZMatrix<long_double>,copy,false);
    lVar5 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    local_1dc = (longdouble)0;
    if (0 < lVar5) {
      local_1dc = (longdouble)0;
      lVar6 = 0;
      do {
        lVar1 = *(longdouble *)((long)this->fElem + lVar6);
        lVar2 = *(longdouble *)((long)A->fElem + lVar6);
        if (lVar1 != lVar2) {
          bVar3 = false;
        }
        if (NAN(lVar1) || NAN(lVar2)) {
          bVar3 = false;
        }
        local_1dc = ABS(lVar1 - lVar2) + local_1dc;
        lVar6 = lVar6 + 0x10;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    if (bVar3 != false) {
      return bVar3;
    }
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,
               "virtual bool TPZFMatrix<long double>::Compare(TPZSavable *, bool) [TVar = long double]"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," did not compare ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," number different terms ",0x18);
    poVar4 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," number terms ",0xe);
    std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," difference in norm L1 ",0x17);
    std::ostream::_M_insert<long_double>(local_1dc);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1d0,local_1c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    if (override) {
      operator=(this,A);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        this->operator=(*fmat);
    }
    return matresult;
}